

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::TriangleCaseBase::testRender(TriangleCaseBase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  TextureFormat log;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RenderTarget *pRVar6;
  RenderTarget *pRVar7;
  Vec4 *extraout_RDX;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *p_01;
  Vec4 *p_02;
  Vec4 *p_03;
  Vec4 *extraout_RDX_00;
  Vec4 *extraout_RDX_01;
  Vec4 *extraout_RDX_02;
  Vec4 *extraout_RDX_03;
  Vec4 *extraout_RDX_04;
  Vec4 *extraout_RDX_05;
  Vec4 *extraout_RDX_06;
  Vec4 *p_04;
  bool bVar8;
  int samples;
  long lVar9;
  pointer pTVar10;
  Context *ctx;
  GLContext *this_02;
  ulong uVar11;
  Surface *dstSurface;
  string v0Properties;
  Surface refSurface;
  string v1Properties;
  Surface testSurface;
  string c2Properties;
  string c1Properties;
  string c0Properties;
  string v2Properties;
  ReferenceContextBuffers buffers;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  Surface *local_6818;
  undefined1 local_6810 [40];
  Surface local_67e8;
  undefined1 local_67d0 [40];
  Surface local_67a8;
  string local_6790;
  string local_6770;
  string local_6750;
  string local_6730;
  ulong local_6710;
  undefined1 local_6708 [384];
  ReferenceContextLimits local_6588;
  ReferenceContextBuffers local_6528;
  ShaderProgram local_64b0;
  GLContext local_6358;
  _func_int **local_61e8;
  undefined8 uStack_61e0;
  
  pRVar6 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  samples = 1;
  if (1 < pRVar6->m_numSamples) {
    samples = pRVar6->m_numSamples;
  }
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e8 = (_func_int **)0x0;
  uStack_61e0._0_4_ = (ApiType)0xc8;
  uStack_61e0._4_4_ = 200;
  this_02 = &local_6358;
  sglr::GLContext::GLContext
            (this_02,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e8);
  local_6588.extensionStr._M_dataplus._M_p = (pointer)&local_6588.extensionStr.field_2;
  local_6588.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6588.maxTextureImageUnits = 0x10;
  local_6588.maxTexture2DSize = 0x800;
  local_6588.maxTextureCubeSize = 0x800;
  local_6588.maxTexture2DArrayLayers = 0x100;
  local_6588.maxTexture3DSize = 0x100;
  local_6588.maxRenderbufferSize = 0x800;
  local_6588.maxVertexAttribs = 0x10;
  local_6588.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6588.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6588.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6588.extensionStr._M_string_length = 0;
  local_6588.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar6 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar7 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_6528,&pRVar6->m_pixelFormat,pRVar7->m_depthBits,0,200,200,samples);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6708,&local_6528.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6708);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6708,&local_6528.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6708);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6708,&local_6528.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6708);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&local_61e8,&local_6588,(MultisamplePixelBufferAccess *)&local_64b0
             ,(MultisamplePixelBufferAccess *)local_6810,(MultisamplePixelBufferAccess *)local_67d0)
  ;
  PositionColorShader::PositionColorShader((PositionColorShader *)&local_64b0);
  local_6818 = &local_67a8;
  tcu::Surface::Surface(local_6818,200,200);
  tcu::Surface::Surface(&local_67e8,200,200);
  poVar1 = (ostringstream *)(local_6708 + 8);
  local_6708._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport: left=",0xf);
  std::ostream::operator<<(poVar1,(this->m_viewport).left);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbottom=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).bottom);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\twidth=",7);
  std::ostream::operator<<(poVar1,(this->m_viewport).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\theight=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
  poVar1 = (ostringstream *)(local_6708 + 8);
  local_6708._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering triangles. Coordinates:",0x21);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
  pTVar10 = (this->m_polys).
            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_polys).
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar10) {
    poVar1 = (ostringstream *)(local_6708 + 8);
    this_00 = (ostringstream *)(local_6708 + 8);
    lVar9 = 0;
    uVar11 = 0;
    p_04 = extraout_RDX;
    do {
      local_6710 = uVar11;
      (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                ((string *)local_6810,(_anonymous_namespace_ *)((long)(pTVar10->p0).m_data + lVar9),
                 p_04);
      (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                ((string *)local_67d0,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_polys).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar9),p);
      (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_6730,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_polys).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->p2).m_data + lVar9),p_00);
      (anonymous_namespace)::genColorString_abi_cxx11_
                (&local_6750,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_polys).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->c0).m_data + lVar9),p_01);
      (anonymous_namespace)::genColorString_abi_cxx11_
                (&local_6770,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_polys).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->c1).m_data + lVar9),p_02);
      (anonymous_namespace)::genColorString_abi_cxx11_
                (&local_6790,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_polys).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->c2).m_data + lVar9),p_03);
      this_01 = (ostringstream *)(local_6708 + 8);
      local_6708._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tv0 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar9));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar9 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar9 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar9 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(char *)local_6810._0_8_,local_6810._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_6750._M_dataplus._M_p,local_6750._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
      local_6708._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tv1 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar9));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar9 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar9 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar9 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_67d0._0_8_,local_67d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_6770._M_dataplus._M_p,local_6770._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
      local_6708._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tv2 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                   lVar9));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                   lVar9 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                   lVar9 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_polys).
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p2).m_data +
                                   lVar9 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_6730._M_dataplus._M_p,local_6730._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_6790._M_dataplus._M_p,local_6790._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
      local_6708._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_6708 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6708,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_6708 + 8));
      std::ios_base::~ios_base((ios_base *)(local_6708 + 0x78));
      p_04 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6790._M_dataplus._M_p != &local_6790.field_2) {
        operator_delete(local_6790._M_dataplus._M_p,local_6790.field_2._M_allocated_capacity + 1);
        p_04 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6770._M_dataplus._M_p != &local_6770.field_2) {
        operator_delete(local_6770._M_dataplus._M_p,local_6770.field_2._M_allocated_capacity + 1);
        p_04 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6750._M_dataplus._M_p != &local_6750.field_2) {
        operator_delete(local_6750._M_dataplus._M_p,local_6750.field_2._M_allocated_capacity + 1);
        p_04 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6730._M_dataplus._M_p != &local_6730.field_2) {
        operator_delete(local_6730._M_dataplus._M_p,local_6730.field_2._M_allocated_capacity + 1);
        p_04 = extraout_RDX_04;
      }
      if (local_67d0._0_8_ != (long)local_67d0 + 0x10) {
        operator_delete((void *)local_67d0._0_8_,local_67d0._16_8_ + 1);
        p_04 = extraout_RDX_05;
      }
      uVar11 = local_6710;
      if (local_6810._0_8_ != (long)local_6810 + 0x10) {
        operator_delete((void *)local_6810._0_8_,local_6810._16_8_ + 1);
        p_04 = extraout_RDX_06;
      }
      uVar11 = uVar11 + 1;
      pTVar10 = (this->m_polys).
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x60;
    } while (uVar11 < (ulong)(((long)(this->m_polys).
                                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 5
                              ) * -0x5555555555555555));
  }
  bVar2 = true;
  do {
    bVar8 = bVar2;
    uVar3 = (*(this_02->super_Context)._vptr_Context[0x75])(this_02,&local_64b0);
    uVar4 = (*(this_02->super_Context)._vptr_Context[0x59])(this_02,(ulong)uVar3,"a_position");
    uVar5 = (*(this_02->super_Context)._vptr_Context[0x59])(this_02,(ulong)uVar3,"a_color");
    (*(this_02->super_Context)._vptr_Context[0x2a])(0,0,0,0x3f800000,this_02);
    (*(this_02->super_Context)._vptr_Context[0x2b])(0x3f800000,this_02);
    (*(this_02->super_Context)._vptr_Context[0x2d])(this_02,0x4100);
    (*(this_02->super_Context)._vptr_Context[5])
              (this_02,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)(this->m_viewport).bottom,
               (ulong)(uint)(this->m_viewport).width,(ulong)(uint)(this->m_viewport).height);
    (*(this_02->super_Context)._vptr_Context[0x76])(this_02,(ulong)uVar3);
    (*(this_02->super_Context)._vptr_Context[0x50])(this_02,(ulong)uVar4);
    (*(this_02->super_Context)._vptr_Context[0x50])(this_02,(ulong)uVar5);
    (*(this_02->super_Context)._vptr_Context[0x4e])
              (this_02,(ulong)uVar4,4,0x1406,0,0x20,
               (this->m_polys).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (*(this_02->super_Context)._vptr_Context[0x4e])
              (this_02,(ulong)uVar5,4,0x1406,0,0x20,
               &((this->m_polys).
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->c0);
    (*(this_02->super_Context)._vptr_Context[0x68])
              (this_02,4,0,
               (ulong)((long)(this->m_polys).
                             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_polys).
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
    (*(this_02->super_Context)._vptr_Context[0x51])(this_02,(ulong)uVar4);
    (*(this_02->super_Context)._vptr_Context[0x51])(this_02,(ulong)uVar5);
    (*(this_02->super_Context)._vptr_Context[0x76])(this_02,0);
    (*(this_02->super_Context)._vptr_Context[0x77])(this_02,(ulong)uVar3);
    (*(this_02->super_Context)._vptr_Context[0x7a])(this_02);
    (*(this_02->super_Context)._vptr_Context[0x80])(this_02,local_6818,0,0,200,200);
    local_6818 = &local_67e8;
    this_02 = (GLContext *)&local_61e8;
    bVar2 = false;
  } while (bVar8);
  local_6810._0_4_ = RGBA;
  local_6810._4_4_ = UNORM_INT8;
  if ((void *)local_67a8.m_pixels.m_cap != (void *)0x0) {
    local_67a8.m_pixels.m_cap = (size_t)local_67a8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_6708,(TextureFormat *)local_6810,local_67a8.m_width,
             local_67a8.m_height,1,(void *)local_67a8.m_pixels.m_cap);
  local_67d0._0_4_ = RGBA;
  local_67d0._4_4_ = UNORM_INT8;
  if ((void *)local_67e8.m_pixels.m_cap != (void *)0x0) {
    local_67e8.m_pixels.m_cap = (size_t)local_67e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_6810,(TextureFormat *)local_67d0,local_67e8.m_width,
             local_67e8.m_height,1,(void *)local_67e8.m_pixels.m_cap);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_6708,local_6810);
  tcu::Surface::~Surface(&local_67e8);
  tcu::Surface::~Surface(&local_67a8);
  sglr::ShaderProgram::~ShaderProgram(&local_64b0);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&local_61e8);
  tcu::TextureLevel::~TextureLevel(&local_6528.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6528.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6528.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6588.extensionStr._M_dataplus._M_p != &local_6588.extensionStr.field_2) {
    operator_delete(local_6588.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_6588.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_6588.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6588.extensionList);
  sglr::GLContext::~GLContext(&local_6358);
  return;
}

Assistant:

void TriangleCaseBase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);
	const int verticesPerTriangle	= 3;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_polys.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_polys[ndx].p0);
		const std::string v1Properties = genClippingPointInfoString(m_polys[ndx].p1);
		const std::string v2Properties = genClippingPointInfoString(m_polys[ndx].p2);
		const std::string c0Properties = genColorString(m_polys[ndx].c0);
		const std::string c1Properties = genColorString(m_polys[ndx].c1);
		const std::string c2Properties = genColorString(m_polys[ndx].c2);

		log << TestLog::Message << "\tv0 (x=" << m_polys[ndx].p0.x() << "\ty=" << m_polys[ndx].p0.y() << "\tz=" << m_polys[ndx].p0.z() << "\tw=" << m_polys[ndx].p0.w() << ")\t" << v0Properties << "\t" << c0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_polys[ndx].p1.x() << "\ty=" << m_polys[ndx].p1.y() << "\tz=" << m_polys[ndx].p1.z() << "\tw=" << m_polys[ndx].p1.w() << ")\t" << v1Properties << "\t" << c1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_polys[ndx].p2.x() << "\ty=" << m_polys[ndx].p2.y() << "\tz=" << m_polys[ndx].p2.z() << "\tw=" << m_polys[ndx].p2.w() << ")\t" << v2Properties << "\t" << c2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	// render test image
	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.enableVertexAttribArray		(colorLoc);
		ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].p0);
		ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].c0);
		ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_polys.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.disableVertexAttribArray	(colorLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	verifyImage(testSurface.getAccess(), refSurface.getAccess());
}